

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

uchar * __thiscall
gl4cts::TextureViewTestCoherency::getStaticColorTextureData
          (TextureViewTestCoherency *this,uint width,uint height)

{
  uint uVar1;
  uchar *puVar2;
  uchar *pixel_data_ptr;
  uint x;
  uchar *row_data_ptr;
  uint y;
  uchar *result_ptr;
  uint height_local;
  uint width_local;
  TextureViewTestCoherency *this_local;
  
  puVar2 = (uchar *)operator_new__((ulong)(width * height * this->m_texture_n_components));
  for (row_data_ptr._4_4_ = 0; row_data_ptr._4_4_ < height;
      row_data_ptr._4_4_ = row_data_ptr._4_4_ + 1) {
    uVar1 = this->m_texture_n_components;
    for (pixel_data_ptr._4_4_ = 0; pixel_data_ptr._4_4_ < width;
        pixel_data_ptr._4_4_ = pixel_data_ptr._4_4_ + 1) {
      *(undefined4 *)
       (puVar2 + (ulong)(pixel_data_ptr._4_4_ * this->m_texture_n_components) +
                 (ulong)(row_data_ptr._4_4_ * width * uVar1)) =
           *(undefined4 *)this->m_static_color_byte;
    }
  }
  return puVar2;
}

Assistant:

unsigned char* TextureViewTestCoherency::getStaticColorTextureData(unsigned int width, unsigned int height) const
{
	/* Prepare the data buffer storing the data we want to replace the region of the
	 * data source with.
	 */
	unsigned char* result_ptr = new unsigned char[width * height * m_texture_n_components];

	for (unsigned int y = 0; y < height; ++y)
	{
		unsigned char* row_data_ptr = result_ptr + y * width * m_texture_n_components;

		for (unsigned int x = 0; x < width; ++x)
		{
			unsigned char* pixel_data_ptr = row_data_ptr + x * m_texture_n_components;

			memcpy(pixel_data_ptr, m_static_color_byte, sizeof(m_static_color_byte));
		} /* for (all columns) */
	}	 /* for (all rows) */

	return result_ptr;
}